

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O0

bool __thiscall ON_Font::SetFontStretch(ON_Font *this,Stretch font_stretch)

{
  bool bVar1;
  Stretch font_stretch_local;
  ON_Font *this_local;
  
  if (this->m_font_stretch != font_stretch) {
    bVar1 = ModificationPermitted
                      (this,"",
                       "/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_font.cpp"
                       ,0x2eb9);
    if (!bVar1) {
      return false;
    }
    this->m_font_stretch = font_stretch;
    Internal_AfterModification(this);
  }
  return true;
}

Assistant:

bool ON_Font::SetFontStretch(
  ON_Font::Stretch font_stretch
  )
{
  if (m_font_stretch != font_stretch)
  {
    if ( false == ON_FONT_MODIFICATION_PERMITTED )
      return false;

    m_font_stretch = font_stretch;
    Internal_AfterModification();
  }
  return true;
}